

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.cc
# Opt level: O2

void __thiscall webrtc::Resampler::~Resampler(Resampler *this)

{
  Resampler *pRVar1;
  
  free(this->state1_);
  free(this->state2_);
  free(this->state3_);
  free(this->in_buffer_);
  free(this->out_buffer_);
  pRVar1 = this->slave_left_;
  if (pRVar1 != (Resampler *)0x0) {
    ~Resampler(pRVar1);
    operator_delete(pRVar1);
  }
  pRVar1 = this->slave_right_;
  if (pRVar1 != (Resampler *)0x0) {
    ~Resampler(pRVar1);
    operator_delete(pRVar1);
    return;
  }
  return;
}

Assistant:

Resampler::~Resampler()
{
    if (state1_)
    {
        free(state1_);
    }
    if (state2_)
    {
        free(state2_);
    }
    if (state3_)
    {
        free(state3_);
    }
    if (in_buffer_)
    {
        free(in_buffer_);
    }
    if (out_buffer_)
    {
        free(out_buffer_);
    }
    if (slave_left_)
    {
        delete slave_left_;
    }
    if (slave_right_)
    {
        delete slave_right_;
    }
}